

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

Token __thiscall slang::parsing::Preprocessor::peek(Preprocessor *this)

{
  bool bVar1;
  long in_RDI;
  Token TVar2;
  Preprocessor *unaff_retaddr;
  undefined8 local_30;
  undefined8 local_28;
  
  bVar1 = Token::operator_cast_to_bool((Token *)0xc4c4be);
  if (!bVar1) {
    TVar2 = nextProcessed(unaff_retaddr);
    local_30 = TVar2._0_8_;
    *(undefined8 *)(in_RDI + 0x1d8) = local_30;
    local_28 = TVar2.info;
    *(Info **)(in_RDI + 0x1e0) = local_28;
  }
  return *(Token *)(in_RDI + 0x1d8);
}

Assistant:

Token Preprocessor::peek() {
    if (!currentToken)
        currentToken = nextProcessed();
    return currentToken;
}